

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O3

void __thiscall write_config(void *this,char *config_path)

{
  ALLEGRO_CONFIG *cfg;
  ulong uVar1;
  char tmp [64];
  char local_78 [72];
  
  cfg = (ALLEGRO_CONFIG *)al_load_config_file(config_path);
  if (cfg == (ALLEGRO_CONFIG *)0x0) {
    cfg = (ALLEGRO_CONFIG *)al_create_config();
  }
  uVar1 = 0;
  do {
    snprintf(local_78,0x40,"button%d",uVar1 & 0xffffffff);
    set_config_int(cfg,"KEYBOARD",local_78,*(int *)(*(long *)((long)this + 0x20) + uVar1 * 4));
    uVar1 = uVar1 + 1;
  } while (uVar1 != 3);
  al_save_config_file(config_path,cfg);
  al_destroy_config(cfg);
  return;
}

Assistant:

static void write_config(VCONTROLLER * this, const char *config_path)
{
   int i;
   char tmp[64];

   ALLEGRO_CONFIG *c = al_load_config_file(config_path);
   if (!c) c = al_create_config();

   for (i = 0; i < 3; i++) {
      snprintf(tmp, sizeof(tmp), "button%d", i);
      set_config_int(c, "KEYBOARD", tmp, ((int *)(this->private_data))[i]);
   }

   al_save_config_file(config_path, c);
   al_destroy_config(c);
}